

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emt.c
# Opt level: O0

void emtval(emtcxdef *ctx,tokdef *tok,uchar *base)

{
  ushort uVar1;
  int iVar2;
  errcxdef *ctx_00;
  long in_RDX;
  uchar *in_RSI;
  long in_RDI;
  emtcxdef *unaff_retaddr;
  ushort oplen;
  undefined6 in_stack_ffffffffffffffc8;
  ushort in_stack_ffffffffffffffce;
  emtcxdef *in_stack_ffffffffffffffd0;
  
  switch(*(undefined4 *)in_RSI) {
  case 0x35:
    emtres(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce);
    uVar1 = *(ushort *)(in_RDI + 0x12);
    *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
    *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 0x1d;
  default:
switchD_00130d50_caseD_39:
    iVar2 = osrp2((void *)(in_RDX + (int)(uint)*(ushort *)(in_RSI + 0x10)));
    emtres(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce);
    memcpy((void *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)*(ushort *)(in_RDI + 0x12)),
           (void *)(in_RDX + (int)(uint)*(ushort *)(in_RSI + 0x10)),(ulong)(ushort)iVar2);
    *(ushort *)(in_RDI + 0x12) = *(short *)(in_RDI + 0x12) + (ushort)iVar2;
    break;
  case 0x36:
    emtres(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce);
    uVar1 = *(ushort *)(in_RDI + 0x12);
    *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
    *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 0x1f;
    goto switchD_00130d50_caseD_39;
  case 0x37:
    emtres(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce);
    uVar1 = *(ushort *)(in_RDI + 0x12);
    *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
    *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 1;
    emtres(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce);
    oswp4s((void *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)*(ushort *)(in_RDI + 0x12)),
           *(long *)(in_RSI + 8));
    *(short *)(in_RDI + 0x12) = *(short *)(in_RDI + 0x12) + 4;
    break;
  case 0x38:
    ctx_00 = (errcxdef *)(ulong)(in_RSI[0x40] - 1);
    switch(ctx_00) {
    case (errcxdef *)0x0:
    case (errcxdef *)0x7:
      emtres((emtcxdef *)ctx_00,in_stack_ffffffffffffffce);
      uVar1 = *(ushort *)(in_RDI + 0x12);
      *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
      *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 0x23;
      break;
    case (errcxdef *)0x1:
    case (errcxdef *)0x6:
      emtres((emtcxdef *)ctx_00,in_stack_ffffffffffffffce);
      uVar1 = *(ushort *)(in_RDI + 0x12);
      *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
      *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 2;
      break;
    case (errcxdef *)0x2:
      emtres((emtcxdef *)ctx_00,in_stack_ffffffffffffffce);
      uVar1 = *(ushort *)(in_RDI + 0x12);
      *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
      *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 0x3c;
      emtres((emtcxdef *)ctx_00,in_stack_ffffffffffffffce);
      uVar1 = *(ushort *)(in_RDI + 0x12);
      *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
      *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 0;
      break;
    case (errcxdef *)0x3:
      if (*(short *)(in_RSI + 0x44) == 0) {
        emtres((emtcxdef *)ctx_00,in_stack_ffffffffffffffce);
        uVar1 = *(ushort *)(in_RDI + 0x12);
        *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
        *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 0x14;
      }
      else {
        emtres((emtcxdef *)ctx_00,in_stack_ffffffffffffffce);
        uVar1 = *(ushort *)(in_RDI + 0x12);
        *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
        *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 0x51;
        emtres((emtcxdef *)ctx_00,in_stack_ffffffffffffffce);
        oswp2((void *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)*(ushort *)(in_RDI + 0x12)),
              (uint)*(ushort *)(in_RDI + 0x2c));
        *(short *)(in_RDI + 0x12) = *(short *)(in_RDI + 0x12) + 2;
        emtres((emtcxdef *)ctx_00,in_stack_ffffffffffffffce);
        oswp2((void *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)*(ushort *)(in_RDI + 0x12)),
              (uint)*(ushort *)(in_RSI + 0x44));
        *(short *)(in_RDI + 0x12) = *(short *)(in_RDI + 0x12) + 2;
      }
      break;
    case (errcxdef *)0x4:
      emtres((emtcxdef *)ctx_00,in_stack_ffffffffffffffce);
      uVar1 = *(ushort *)(in_RDI + 0x12);
      *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
      *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 0x1c;
      return;
    case (errcxdef *)0x5:
      emtres((emtcxdef *)ctx_00,in_stack_ffffffffffffffce);
      uVar1 = *(ushort *)(in_RDI + 0x12);
      *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
      *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 0x1e;
      emtres((emtcxdef *)ctx_00,in_stack_ffffffffffffffce);
      uVar1 = *(ushort *)(in_RDI + 0x12);
      *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
      *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 0;
      break;
    default:
      errsigf(ctx_00,(char *)CONCAT26(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8),0);
    case (errcxdef *)0xc:
      emtres((emtcxdef *)ctx_00,in_stack_ffffffffffffffce);
      uVar1 = *(ushort *)(in_RDI + 0x12);
      *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
      *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 0x4c;
      return;
    case (errcxdef *)0xd:
      emtres((emtcxdef *)ctx_00,in_stack_ffffffffffffffce);
      uVar1 = *(ushort *)(in_RDI + 0x12);
      *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
      *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 0x24;
    }
    emtres((emtcxdef *)ctx_00,in_stack_ffffffffffffffce);
    oswp2((void *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)*(ushort *)(in_RDI + 0x12)),
          (uint)*(ushort *)(in_RSI + 0x42));
    *(short *)(in_RDI + 0x12) = *(short *)(in_RDI + 0x12) + 2;
    break;
  case 0x4c:
    emtres(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce);
    uVar1 = *(ushort *)(in_RDI + 0x12);
    *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
    *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 0x20;
    emtlst(unaff_retaddr,(uint)((ulong)in_RDI >> 0x20),in_RSI);
    break;
  case 0x4d:
    emtres(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce);
    uVar1 = *(ushort *)(in_RDI + 0x12);
    *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
    *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 0x21;
    break;
  case 0x4e:
    emtres(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce);
    uVar1 = *(ushort *)(in_RDI + 0x12);
    *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
    *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 0x22;
    break;
  case 0x55:
    emtres(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce);
    uVar1 = *(ushort *)(in_RDI + 0x12);
    *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
    *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 0x43;
    emtres(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce);
    oswp2((void *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)*(ushort *)(in_RDI + 0x12)),
          (uint)*(ushort *)(in_RSI + 0x10));
    *(short *)(in_RDI + 0x12) = *(short *)(in_RDI + 0x12) + 2;
  }
  return;
}

Assistant:

void emtval(emtcxdef *ctx, tokdef *tok, uchar *base)
{
    ushort oplen;
        
    switch(tok->toktyp)
    {
    case TOKTSYMBOL:
        switch(tok->toksym.tokstyp)
        {
        case TOKSTARGC:
            emtop(ctx, OPCARGC);
            return;
            
        case TOKSTSELF:
            emtop(ctx, OPCPUSHSELF);
            return;
            
        case TOKSTOBJ:
        case TOKSTFWDOBJ:
            emtop(ctx, OPCPUSHOBJ);
            break;
        case TOKSTLOCAL:
            if (tok->toksym.toksfr)
            {
                emtop(ctx, OPCGETDBLCL);   /* debug local - specifies frame */
                emtint2(ctx, ctx->emtcxfrob);          /* emit frame object */
                emtint2(ctx, tok->toksym.toksfr);      /* emit frame offset */
            }
            else
                emtop(ctx, OPCGETLCL);
            break;
            
        case TOKSTBIFN:
            emtop(ctx, OPCBUILTIN);
            emtbyte(ctx, 0);
            break;
        case TOKSTFUNC:
        case TOKSTFWDFN:
            emtop(ctx, OPCPUSHFN);
            break;
        case TOKSTPROP:
            emtop(ctx, OPCGETPSELF);
            emtbyte(ctx, 0);
            break;
        case TOKSTPROPSPEC:
            emtop(ctx, OPCGETPSELFDATA);
            break;
        default:
            errsig(ctx->emtcxerr, ERR_REQOBJ);
            /* NOTREACHED */
        }
        emtint2(ctx, tok->toksym.toksval);
        return;

    case TOKTNUMBER:
        emtop(ctx, OPCPUSHNUM);
        emtint4(ctx, tok->tokval);
        return;

    case TOKTNIL:
        emtop(ctx, OPCPUSHNIL);
        return;
    case TOKTTRUE:
        emtop(ctx, OPCPUSHTRUE);
        return;
        
    case TOKTPOUND:
        emtop(ctx, OPCPUSHPN);
        emtint2(ctx, tok->tokofs);
        return;

    case TOKTSSTRING:
        emtop(ctx, OPCPUSHSTR);
        break;
    case TOKTDSTRING:
        emtop(ctx, OPCSAY);
        break;
    case TOKTLIST:
        emtop(ctx, OPCPUSHLST);
        emtlst(ctx, (uint)tok->tokofs, base);
        return;
    }

    /* if we haven't returned already, we have a large operand */
    oplen = osrp2(base + tok->tokofs);
    emtmem(ctx, base + tok->tokofs, oplen);
}